

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O2

CURLcode tunnel_reinit(Curl_cfilter *cf,Curl_easy *data,h1_tunnel_state_conflict *ts)

{
  byte *pbVar1;
  CURLcode extraout_EAX;
  
  Curl_dyn_reset((dynbuf *)cf);
  Curl_dyn_reset((dynbuf *)&cf->sockindex);
  *(undefined4 *)&cf[4].next = 0;
  cf[3].sockindex = 1;
  cf[4].cft = (Curl_cftype *)0x0;
  pbVar1 = (byte *)((long)&cf[4].next + 4);
  *pbVar1 = *pbVar1 & 0xfd;
  return extraout_EAX;
}

Assistant:

static CURLcode tunnel_reinit(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              struct h1_tunnel_state *ts)
{
  (void)data;
  (void)cf;
  DEBUGASSERT(ts);
  Curl_dyn_reset(&ts->rcvbuf);
  Curl_dyn_reset(&ts->request_data);
  ts->tunnel_state = H1_TUNNEL_INIT;
  ts->keepon = KEEPON_CONNECT;
  ts->cl = 0;
  ts->close_connection = FALSE;
  return CURLE_OK;
}